

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero-delay-observer.cpp
# Opt level: O2

void __thiscall
stateObservation::ZeroDelayObserver::setInput(ZeroDelayObserver *this,InputVector *u_k,TimeIndex k)

{
  IndexedVectorArray *this_00;
  uint __line;
  bool bVar1;
  int iVar2;
  size_type sVar3;
  TimeIndex TVar4;
  char *__assertion;
  
  if ((this->super_ObserverBase).p_ < 1) {
    return;
  }
  iVar2 = (*(this->super_ObserverBase)._vptr_ObserverBase[0x1c])();
  if ((char)iVar2 != '\0') {
    this_00 = &this->u_;
    sVar3 = std::
            deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
            ::size(&(this->u_).v_);
    if ((long)sVar3 < 1) {
      if ((this->x_).
          super_DebugItem<bool,_stateObservation::DebugItemDefaultValue<bool,_true>,_true>.b_ ==
          true) {
        TVar4 = IndexedMatrixT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_false>::getTime(&this->x_);
        if (TVar4 != k) {
          TVar4 = IndexedMatrixT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_false>::getTime(&this->x_);
          if (TVar4 != k + -1) {
            __assertion = 
            "(!x_.isSet() || x_.getTime() == k || x_.getTime() == k - 1) && \"ERROR: The time is set incorrectly for the                           inputs (must be [current_time] or [current_time+1])\""
            ;
            __line = 99;
            goto LAB_00141fc0;
          }
        }
      }
    }
    else {
      TVar4 = IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
              ::getNextIndex(this_00);
      if (TVar4 != k) {
        bVar1 = IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
                ::checkIndex(this_00,k);
        if (!bVar1) {
          __assertion = 
          "(u_.getNextIndex() == k || u_.checkIndex(k)) && \"ERROR: The time is set incorrectly                                 for the inputs (order or gap)\""
          ;
          __line = 0x5e;
          goto LAB_00141fc0;
        }
      }
    }
    IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::setValue(this_00,u_k,k);
    return;
  }
  __assertion = "checkInputVector(u_k) && \"The size of the input vector is incorrect\"";
  __line = 0x5a;
LAB_00141fc0:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/src/zero-delay-observer.cpp"
                ,__line,
                "virtual void stateObservation::ZeroDelayObserver::setInput(const ObserverBase::InputVector &, TimeIndex)"
               );
}

Assistant:

void ZeroDelayObserver::setInput(const ObserverBase::InputVector & u_k, TimeIndex k)
{
  if(p_ > 0)
  {
    BOOST_ASSERT(checkInputVector(u_k) && "The size of the input vector is incorrect");

    if(u_.size() > 0)
      BOOST_ASSERT((u_.getNextIndex() == k || u_.checkIndex(k)) && "ERROR: The time is set incorrectly \
                                for the inputs (order or gap)");
    else
    {
      BOOST_ASSERT((!x_.isSet() || x_.getTime() == k || x_.getTime() == k - 1)
                   && "ERROR: The time is set incorrectly for the \
                          inputs (must be [current_time] or [current_time+1])");
    }

    u_.setValue(u_k, k);
  }
}